

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O1

void Abc_NtkShow(Abc_Ntk_t *pNtk0,int fGateNames,int fSeq,int fUseReverse)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  FILE *__stream;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  char FileNameDot [200];
  char local_f8 [200];
  
  if (pNtk0->ntkType != ABC_NTK_LOGIC) {
    if (pNtk0->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk0) || Abc_NtkIsLogic(pNtk0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcShow.c"
                    ,0x111,"void Abc_NtkShow(Abc_Ntk_t *, int, int, int)");
    }
    iVar3 = Abc_NtkGetChoiceNum(pNtk0);
    if (iVar3 != 0) {
      puts("Temporarily visualization of AIGs with choice nodes is disabled.");
      return;
    }
  }
  Abc_ShowGetFileName(pNtk0->pName,local_f8);
  __stream = fopen(local_f8,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",local_f8);
  }
  else {
    fclose(__stream);
    pNtk = Abc_NtkDup(pNtk0);
    if ((pNtk->ntkType == ABC_NTK_LOGIC) && (pNtk->ntkFunc != ABC_FUNC_MAP)) {
      Abc_NtkToSop(pNtk,-1,1000000000);
    }
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    vNodes->pArray = ppvVar4;
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        pvVar2 = pVVar5->pArray[lVar6];
        if (pvVar2 != (void *)0x0) {
          uVar1 = vNodes->nCap;
          if (vNodes->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
              }
              iVar3 = 0x10;
            }
            else {
              iVar3 = uVar1 * 2;
              if (iVar3 <= (int)uVar1) goto LAB_00867d96;
              if (vNodes->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
              }
            }
            vNodes->pArray = ppvVar4;
            vNodes->nCap = iVar3;
          }
LAB_00867d96:
          iVar3 = vNodes->nSize;
          vNodes->nSize = iVar3 + 1;
          vNodes->pArray[iVar3] = pvVar2;
        }
        lVar6 = lVar6 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar6 < pVVar5->nSize);
    }
    iVar3 = pNtk->nBarBufs;
    pNtk->nBarBufs = 0;
    if (fSeq == 0) {
      Io_WriteDotNtk(pNtk,vNodes,(Vec_Ptr_t *)0x0,local_f8,fGateNames,fUseReverse);
    }
    else {
      Io_WriteDotSeq(pNtk,vNodes,(Vec_Ptr_t *)0x0,local_f8,fGateNames,fUseReverse);
    }
    pNtk->nBarBufs = iVar3;
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
      vNodes->pArray = (void **)0x0;
    }
    free(vNodes);
    Abc_ShowFile(local_f8);
    Abc_NtkDelete(pNtk);
  }
  return;
}

Assistant:

void Abc_NtkShow( Abc_Ntk_t * pNtk0, int fGateNames, int fSeq, int fUseReverse )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int nBarBufs;
    char FileNameDot[200];
    int i;

    assert( Abc_NtkIsStrash(pNtk0) || Abc_NtkIsLogic(pNtk0) );
    if ( Abc_NtkIsStrash(pNtk0) && Abc_NtkGetChoiceNum(pNtk0) )
    {
        printf( "Temporarily visualization of AIGs with choice nodes is disabled.\n" );
        return;
    }
    // create the file name
    Abc_ShowGetFileName( pNtk0->pName, FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );


    // convert to logic SOP
    pNtk = Abc_NtkDup( pNtk0 );
    if ( Abc_NtkIsLogic(pNtk) && !Abc_NtkHasMapping(pNtk) )
        Abc_NtkToSop( pNtk, -1, ABC_INFINITY );

    // collect all nodes in the network
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_PtrPush( vNodes, pNode );
    // write the DOT file
    nBarBufs = pNtk->nBarBufs;
    pNtk->nBarBufs = 0;
    if ( fSeq )
        Io_WriteDotSeq( pNtk, vNodes, NULL, FileNameDot, fGateNames, fUseReverse );
    else
        Io_WriteDotNtk( pNtk, vNodes, NULL, FileNameDot, fGateNames, fUseReverse );
    pNtk->nBarBufs = nBarBufs;
    Vec_PtrFree( vNodes );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
    Abc_NtkDelete( pNtk );
}